

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O1

TPZFMatrix<TFad<6,_double>_> * __thiscall
TPZTensor::operator_cast_to_TPZFMatrix
          (TPZFMatrix<TFad<6,_double>_> *__return_storage_ptr__,TPZTensor *this)

{
  int64_t *piVar1;
  TFad<6,_double> **ppTVar2;
  undefined8 *puVar3;
  TFad<6,_double> *pTVar4;
  int i;
  undefined8 *puVar5;
  int i_5;
  long lVar6;
  TFad<6,_double> *pTVar7;
  int i_1;
  long lVar8;
  long lVar9;
  
  (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow = 0;
  (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol = 0;
  (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow = 3;
  (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol = 3;
  (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fDecomposed = '\0'
  ;
  (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fDefPositive =
       '\0';
  (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0185a9b8;
  __return_storage_ptr__->fElem = (TFad<6,_double> *)0x0;
  __return_storage_ptr__->fGiven = (TFad<6,_double> *)0x0;
  __return_storage_ptr__->fSize = 0;
  TPZVec<int>::TPZVec(&(__return_storage_ptr__->fPivot).super_TPZVec<int>,0);
  (__return_storage_ptr__->fPivot).super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (__return_storage_ptr__->fPivot).super_TPZVec<int>.fStore =
       (__return_storage_ptr__->fPivot).fExtAlloc;
  (__return_storage_ptr__->fPivot).super_TPZVec<int>.fNElements = 0;
  (__return_storage_ptr__->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (__return_storage_ptr__->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01862b38;
  (__return_storage_ptr__->fWork).fStore = (TFad<6,_double> *)0x0;
  (__return_storage_ptr__->fWork).fNElements = 0;
  (__return_storage_ptr__->fWork).fNAlloc = 0;
  puVar5 = (undefined8 *)operator_new__(0x248);
  piVar1 = &(__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow;
  ppTVar2 = &__return_storage_ptr__->fElem;
  *puVar5 = 9;
  lVar6 = 0x10;
  do {
    *(undefined ***)((long)puVar5 + lVar6 + -8) = &PTR__TFad_0185d2b8;
    *(undefined8 *)((long)puVar5 + lVar6) = 0;
    ((undefined8 *)((long)puVar5 + lVar6))[1] = 0;
    puVar3 = (undefined8 *)((long)puVar5 + lVar6 + 0x10);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)puVar5 + lVar6 + 0x20);
    *puVar3 = 0;
    puVar3[1] = 0;
    *(undefined8 *)((long)puVar5 + lVar6 + 0x30) = 0;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x250);
  __return_storage_ptr__->fElem = (TFad<6,_double> *)(puVar5 + 1);
  pTVar7 = *(TFad<6,_double> **)(this + 0x10);
  if (((__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pTVar4 = *ppTVar2;
  if (pTVar4 != pTVar7) {
    lVar6 = 2;
    do {
      pTVar4->dx_[lVar6 + -2] = pTVar7->dx_[lVar6 + -2];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    pTVar4->val_ = pTVar7->val_;
  }
  pTVar7 = *(TFad<6,_double> **)(this + 0x10);
  if (((__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pTVar4 = *ppTVar2;
  if (pTVar4 != pTVar7) {
    lVar6 = 0;
    do {
      pTVar4[1].dx_[lVar6] = pTVar7[1].dx_[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    pTVar4[1].val_ = pTVar7[1].val_;
  }
  if (((__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = *piVar1;
  pTVar7 = *ppTVar2 + lVar6;
  if (pTVar7 != pTVar4 + 1) {
    lVar8 = 0;
    do {
      pTVar7->dx_[lVar8] = pTVar4[1].dx_[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 6);
    pTVar7->val_ = pTVar4[1].val_;
  }
  pTVar7 = *(TFad<6,_double> **)(this + 0x10);
  if ((lVar6 < 3) ||
     ((__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pTVar4 = *ppTVar2;
  if (pTVar4 != pTVar7) {
    lVar6 = 0;
    do {
      pTVar4[2].dx_[lVar6] = pTVar7[2].dx_[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    pTVar4[2].val_ = pTVar7[2].val_;
  }
  if ((0 < (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow) &&
     (2 < (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol)) {
    lVar6 = *piVar1;
    pTVar7 = *ppTVar2 + lVar6 * 2;
    if (pTVar7 != pTVar4 + 2) {
      lVar8 = 0;
      do {
        pTVar7->dx_[lVar8] = pTVar4[2].dx_[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      pTVar7->val_ = pTVar4[2].val_;
    }
    lVar8 = *(long *)(this + 0x10);
    if ((lVar6 < 2) ||
       ((__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pTVar7 = *ppTVar2;
    lVar6 = *piVar1;
    if (pTVar7 + lVar6 + 1 != (TFad<6,_double> *)(lVar8 + 0xc0)) {
      lVar9 = 0;
      do {
        pTVar7[lVar6 + 1].dx_[lVar9] = *(double *)(lVar8 + 0xd0 + lVar9 * 8);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 6);
      pTVar7[lVar6 + 1].val_ = *(double *)(lVar8 + 200);
    }
    lVar8 = *(long *)(this + 0x10);
    if ((2 < lVar6) &&
       (1 < (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol)) {
      pTVar7 = *ppTVar2;
      lVar6 = *piVar1;
      if (pTVar7 + lVar6 + 2 != (TFad<6,_double> *)(lVar8 + 0x100)) {
        lVar9 = 0;
        do {
          pTVar7[lVar6 + 2].dx_[lVar9] = *(double *)(lVar8 + 0x110 + lVar9 * 8);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 6);
        pTVar7[lVar6 + 2].val_ = *(double *)(lVar8 + 0x108);
      }
      if ((lVar6 < 2) ||
         ((__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol < 3))
      {
        TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pTVar4 = *ppTVar2;
      lVar8 = *piVar1;
      if (pTVar4 + lVar8 * 2 + 1 != pTVar7 + lVar6 + 2) {
        lVar9 = 0;
        do {
          pTVar4[lVar8 * 2 + 1].dx_[lVar9] = pTVar7[lVar6 + 2].dx_[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 6);
        pTVar4[lVar8 * 2 + 1].val_ = pTVar7[lVar6 + 2].val_;
      }
      lVar6 = *(long *)(this + 0x10);
      if ((2 < lVar8) &&
         (2 < (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol))
      {
        pTVar7 = *ppTVar2;
        lVar8 = *piVar1;
        if (pTVar7 + lVar8 * 2 + 2 != (TFad<6,_double> *)(lVar6 + 0x140)) {
          lVar9 = 0;
          do {
            pTVar7[lVar8 * 2 + 2].dx_[lVar9] = *(double *)(lVar6 + 0x150 + lVar9 * 8);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 6);
          pTVar7[lVar8 * 2 + 2].val_ = *(double *)(lVar6 + 0x148);
        }
        return __return_storage_ptr__;
      }
      TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

operator TPZFMatrix<T>() const {
        TPZFMatrix<T> result(3, 3);
        result(0, 0) = XX();
        result(0, 1) = result(1, 0) = XY();
        result(0, 2) = result(2, 0) = XZ();
        result(1, 1) = YY();
        result(1, 2) = result(2, 1) = YZ();
        result(2, 2) = ZZ();
        return result;
    }